

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# COpenGLCoreCacheHandler.h
# Opt level: O0

void __thiscall
irr::video::
COpenGLCoreCacheHandler<irr::video::COpenGLDriver,_irr::video::COpenGLCoreTexture<irr::video::COpenGLDriver>_>
::setColorMask(COpenGLCoreCacheHandler<irr::video::COpenGLDriver,_irr::video::COpenGLCoreTexture<irr::video::COpenGLDriver>_>
               *this,u8 mask)

{
  byte in_SIL;
  long in_RDI;
  GLuint i;
  uint local_10;
  
  if ((**(byte **)(in_RDI + 0x88) != in_SIL) || ((*(byte *)(in_RDI + 0x90) & 1) != 0)) {
    (*GL.ColorMask)((in_SIL & 2) != 0,(in_SIL & 4) != 0,(in_SIL & 8) != 0,(in_SIL & 1) != 0);
    for (local_10 = 0; local_10 < *(uint *)(in_RDI + 0x48); local_10 = local_10 + 1) {
      *(byte *)(*(long *)(in_RDI + 0x88) + (ulong)local_10) = in_SIL;
    }
    *(undefined1 *)(in_RDI + 0x90) = 0;
  }
  return;
}

Assistant:

void setColorMask(u8 mask)
	{
		if (ColorMask[0] != mask || ColorMaskInvalid) {
			GL.ColorMask((mask & ECP_RED) ? GL_TRUE : GL_FALSE, (mask & ECP_GREEN) ? GL_TRUE : GL_FALSE, (mask & ECP_BLUE) ? GL_TRUE : GL_FALSE, (mask & ECP_ALPHA) ? GL_TRUE : GL_FALSE);

			for (GLuint i = 0; i < FrameBufferCount; ++i)
				ColorMask[i] = mask;

			ColorMaskInvalid = false;
		}
	}